

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O0

bool __thiscall Ruleset::isTrump(Ruleset *this,Card *card)

{
  bool bVar1;
  int iVar2;
  reference ppRVar3;
  Rule *rule;
  iterator __end1;
  iterator __begin1;
  vector<Rule_*,_std::allocator<Rule_*>_> *__range1;
  bool previous;
  Card *card_local;
  Ruleset *this_local;
  
  __range1._7_1_ = false;
  __end1 = std::vector<Rule_*,_std::allocator<Rule_*>_>::begin(&this->m_ruleInstances);
  rule = (Rule *)std::vector<Rule_*,_std::allocator<Rule_*>_>::end(&this->m_ruleInstances);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_>
                                *)&rule);
    if (!bVar1) break;
    ppRVar3 = __gnu_cxx::__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_>::
              operator*(&__end1);
    iVar2 = (**(*ppRVar3)->_vptr_Rule)(*ppRVar3,(ulong)__range1._7_1_,card,__range1._7_1_);
    __range1._7_1_ = (bool)((byte)iVar2 & 1);
    __gnu_cxx::__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_>::operator++
              (&__end1);
  }
  return __range1._7_1_;
}

Assistant:

bool Ruleset::isTrump(const Card &card) {
    bool previous = false;
    for(auto rule : m_ruleInstances){
        previous = rule->isTrump(previous, card);
    }
    return previous;
}